

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O3

_Bool borg_test_stuff(void)

{
  ushort uVar1;
  bool bVar2;
  _Bool _Var3;
  _Bool _Var4;
  wchar_t wVar5;
  int iVar6;
  char *pcVar7;
  uint uVar8;
  borg_item_conflict *pbVar9;
  ulong uVar10;
  keycode_t k;
  int iVar11;
  long lVar12;
  uint local_38;
  int local_34;
  
  _Var3 = borg_spell_legal(IDENTIFY_RUNE);
  if (((0x31 < borg.trait[0x1e]) || (_Var4 = borg_spell_legal(IDENTIFY_RUNE), !_Var4)) ||
     (_Var4 = borg_check_rest(borg.c.y,borg.c.x), _Var4)) {
    wVar5 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
    if (L'\x01' < wVar5) {
      return false;
    }
    uVar1 = z_info->pack_size;
    uVar8 = (uint)z_info->quiver_size + (uint)uVar1 + 0xc;
    if (uVar8 < uVar1 || uVar8 == uVar1) {
      local_38 = 0xffffffff;
      local_34 = -1;
    }
    else {
      uVar10 = (ulong)(uint)uVar1;
      lVar12 = uVar10 * 0x388;
      local_38 = 0xffffffff;
      local_34 = -1;
      pbVar9 = borg_items;
      do {
        if ((pbVar9->curses[lVar12 + -0x26] != false) && (pbVar9->curses[lVar12 + -0x2d] == true)) {
          if (pbVar9->curses[lVar12 + -0x22] == false) {
            iVar11 = 0;
          }
          else {
            iVar11 = *(int *)(pbVar9->curses + lVar12 + -6) + 150000;
          }
          _Var4 = borg_ego_has_random_power(e_info + pbVar9->curses[lVar12 + -0x21]);
          if (_Var4) {
            iVar11 = *(int *)(pbVar9->curses + lVar12 + -6) + 100000;
          }
          _Var4 = borg_item_note_needs_id((borg_item_conflict *)(pbVar9->desc + lVar12));
          if (_Var4) {
            iVar11 = *(int *)(pbVar9->curses + lVar12 + -6) + 20000;
          }
          pbVar9 = borg_items;
          if ((iVar11 != 0) && (local_34 < iVar11)) {
            local_38 = (uint)uVar10;
            local_34 = iVar11;
          }
        }
        uVar10 = uVar10 + 1;
        uVar1 = z_info->pack_size;
        lVar12 = lVar12 + 0x388;
      } while (uVar10 < (uint)z_info->quiver_size + (uint)uVar1 + 0xc);
    }
    uVar8 = (uint)uVar1;
    lVar12 = 0;
    uVar10 = 0;
    bVar2 = false;
    do {
      pbVar9 = borg_items;
      if ((borg_items->curses[lVar12 + -0x26] == false) ||
         (borg_items->curses[lVar12 + -0x2d] != true)) goto LAB_0022d7e0;
      if (borg_items->curses[lVar12 + -0x22] == false) {
        iVar11 = 0;
      }
      else {
        iVar11 = *(int *)(borg_items->curses + lVar12 + -6) + 150000;
      }
      pcVar7 = borg_items->desc;
      _Var4 = borg_item_note_needs_id((borg_item_conflict *)(pcVar7 + lVar12));
      if (_Var4) {
        iVar11 = *(int *)(pbVar9->curses + lVar12 + -6) + 20000;
      }
      else if ((_Var3) || (_Var4 = borg_item_worth_id((borg_item *)(pcVar7 + lVar12)), _Var4)) {
        iVar11 = *(int *)(pbVar9->curses + lVar12 + -6);
      }
      if (pbVar9->curses[lVar12 + -0x2c] != false) goto switchD_0022d733_caseD_1b;
      switch(pbVar9->curses[lVar12 + -0x2a]) {
      case true:
      case true:
        iVar6 = borg.trait[0x6a] * 5000;
        goto LAB_0022d7b0;
      case true:
      case true:
        iVar6 = borg.trait[0x6a] * 2000;
        goto LAB_0022d7b0;
      case true:
        iVar6 = borg.trait[0x6a] * 3000;
LAB_0022d7b0:
        iVar11 = iVar11 + iVar6;
        break;
      case true:
      case true:
        if (4 < borg.trait[0x6a]) {
          iVar6 = borg.trait[0x6a] * 500;
          goto LAB_0022d7b0;
        }
        break;
      case true:
        iVar11 = iVar11 + borg.trait[0x6a] * 10;
      }
switchD_0022d733_caseD_1b:
      bVar2 = (bool)(bVar2 | uVar10 < uVar8);
      if ((iVar11 != 0) && (local_34 < iVar11)) {
        local_38 = (uint)uVar10;
        local_34 = iVar11;
      }
LAB_0022d7e0:
      uVar10 = uVar10 + 1;
      uVar8 = (uint)z_info->pack_size;
      lVar12 = lVar12 + 0x388;
    } while (uVar10 < z_info->quiver_size + uVar8 + 0xc);
    if (-1 < (int)local_38) {
      pbVar9 = borg_items + local_38;
      _Var3 = borg_spell(IDENTIFY_RUNE);
      if ((_Var3) || (_Var3 = borg_read_scroll(sv_scroll_identify), _Var3)) {
        pcVar7 = format("# Identifying %s.",pbVar9);
        borg_note(pcVar7);
        uVar1 = z_info->pack_size;
        if ((local_38 < uVar1) || (uVar1 + 0xc <= local_38)) {
          if (local_38 < uVar1 + 0xc) {
            k = (keycode_t)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[local_38];
          }
          else {
            borg_keypress(0x7c);
            k = (local_38 - z_info->pack_size) + 0x24;
          }
        }
        else {
          if (bVar2) {
            borg_keypress(0x2f);
            uVar1 = z_info->pack_size;
          }
          k = (keycode_t)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[(int)(local_38 - uVar1)]
          ;
        }
        borg_keypress(k);
        borg_keypress(0xe000);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool borg_test_stuff(void)
{
    int  i;
    int  b_i = -1, b_v = -1;
    bool inv_item_needs_id = false;
    bool free_id           = borg_spell_legal(IDENTIFY_RUNE);

    /* don't ID stuff when you can't recover spent spell point immediately */
    if (borg.trait[BI_CURSP] < 50 && borg_spell_legal(IDENTIFY_RUNE)
        && !borg_check_rest(borg.c.y, borg.c.x))
        return false;

    /* No ID if in danger */
    if (borg_danger(borg.c.y, borg.c.x, 1, true, false) > 1)
        return false;

    /* Look for an item to identify (equipment) */
    for (i = INVEN_WIELD; i < QUIVER_END; i++) {
        int        v    = 0;
        borg_item *item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;
        if (!item->needs_ident)
            continue;

        /* Preferentially ID egos and artifacts */
        if (item->art_idx)
            v = item->value + 150000L;

        if (borg_ego_has_random_power(&e_info[item->ego_idx])) {
            v = item->value + 100000L;
        }

        /* Prioritize the ID */
        if (borg_item_note_needs_id(item))
            v = item->value + 20000L;

        /* Ignore */
        if (!v)
            continue;

        /* Track the best */
        if (v <= b_v)
            continue;

        /* Track it */
        b_i = i;
        b_v = v;
    }

    /* Look for an item to identify  */
    for (i = 0; i < QUIVER_END; i++) {
        int        v    = 0;
        borg_item *item = &borg_items[i];

        /* Skip empty and ID'd items */
        if (!item->iqty)
            continue;
        if (!item->needs_ident)
            continue;

        if (i < z_info->pack_size)
            inv_item_needs_id = true;

        /* Preferentially ID artifacts */
        if (item->art_idx)
            v = item->value + 150000L;

        /* Identify "good" items */
        if (borg_item_note_needs_id(item))
            v = item->value + 20000L;
        else if (free_id || borg_item_worth_id(item))
            v = item->value;

        /* Hack -- reward "unaware" items */
        if (!item->aware) {
            /* Analyze the type */
            switch (item->tval) {
            case TV_RING:
            case TV_AMULET:
                v += (borg.trait[BI_MAXDEPTH] * 5000L);
                break;

            case TV_ROD:
                v += (borg.trait[BI_MAXDEPTH] * 3000L);
                break;

            case TV_WAND:
            case TV_STAFF:
                v += (borg.trait[BI_MAXDEPTH] * 2000L);
                break;

            case TV_POTION:
            case TV_SCROLL:
                /* Hack -- boring levels */
                if (borg.trait[BI_MAXDEPTH] < 5)
                    break;

                /* Hack -- reward depth */
                v += (borg.trait[BI_MAXDEPTH] * 500L);
                break;

            case TV_FOOD:
                v += (borg.trait[BI_MAXDEPTH] * 10L);
                break;
            }
        }

        /* Ignore */
        if (!v)
            continue;

        /* Track the best */
        if (v <= b_v)
            continue;

        /* Track it */
        b_i = i;
        b_v = v;
    }

    /* Found something */
    if (b_i >= 0) {
        borg_item *item = &borg_items[b_i];

        /* Use an item to identify */
        if (borg_spell(IDENTIFY_RUNE) || borg_read_scroll(sv_scroll_identify)) {
            /* Log -- may be cancelled */
            borg_note(format("# Identifying %s.", item->desc));

            /* Equipment */
            if (b_i >= INVEN_WIELD && b_i < QUIVER_START) {
                if (inv_item_needs_id)
                    borg_keypress('/');

                /* Select the item */
                borg_keypress(all_letters_nohjkl[b_i - INVEN_WIELD]);

            } else if (b_i >= QUIVER_START) {
                /* Select quiver */
                borg_keypress('|');

                /* Select the item */
                borg_keypress(I2D(b_i - QUIVER_START));
            }
            /* Inventory */
            else {
                /* Select the item */
                borg_keypress(all_letters_nohjkl[b_i]);
            }

            borg_keypress(ESCAPE);

            return true;
        }
    }

    /* Nothing to do */
    return false;
}